

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O2

VectorXd __thiscall mnf::operator-(mnf *this,Point *x,Point *y)

{
  Manifold *this_00;
  Index extraout_RDX;
  VectorXd VVar1;
  ConstRefVec local_88;
  ConstRefVec local_60;
  RefVec local_38;
  
  local_88.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_data = (PointerType)Manifold::dim((x->super_SubPoint).super_ConstSubPoint.manifold_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,(long *)&local_88);
  this_00 = (x->super_SubPoint).super_ConstSubPoint.manifold_;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_38,
             (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_88,
             &(y->super_SubPoint).super_ConstSubPoint.value_.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            );
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_60,
             &(x->super_SubPoint).super_ConstSubPoint.value_.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            );
  Manifold::pseudoLog(this_00,&local_38,&local_88,&local_60);
  free(local_60.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(local_88.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd operator-(const Point& x, const Point& y)
{
  Eigen::VectorXd output(x.getManifold().dim());
  x.getManifold().pseudoLog(output, y.value(), x.value());
  return output;
}